

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyInvalidOperationErrors
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  stringstream *log;
  bool bVar1;
  GLenum GVar2;
  GLint immutableFormat;
  
  log = &this->mLog;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Verify INVALID_OPERATION Errors - ",0x22);
  gl4cts::Texture::Generate(gl,texture);
  (*gl->bindTexture)(target,*texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"texParameteri error occurred for GL_TEXTURE_SPARSE_ARB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x89d);
  (*gl->getTexParameteriv)(target,0x912f,&immutableFormat);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"getTexParameteriv error occurred for GL_TEXTURE_IMMUTABLE_FORMAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x8a2);
  if (immutableFormat == 0) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
               (ulong)(uint)(this->mState).pageSizeX,(ulong)(uint)(this->mState).pageSizeY,
               (ulong)(uint)(this->mState).pageSizeZ,1);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError
                      (log,"texPageCommitment [GL_TEXTURE_IMMUTABLE_FORMAT texture]",GVar2,0x502);
    if (!bVar1) goto LAB_00a6d0ae;
  }
  (*gl->deleteTextures)(1,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xd4);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
             (ulong)(uint)(this->mState).pageSizeX,(ulong)(uint)(this->mState).pageSizeY,
             (ulong)(uint)(this->mState).pageSizeZ,1);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError
                    (log,"texPageCommitment [not TEXTURE_SPARSE_ARB texture]",GVar2,0x502);
  if (bVar1) {
    (*gl->deleteTextures)(1,texture);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xd4);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
               (ulong)(uint)((this->mState).pageSizeX + (this->mState).width),
               (ulong)(uint)(this->mState).height,(ulong)(uint)(this->mState).depth,1);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError
                      (log,"texPageCommitment [commitment width greater than expected]",GVar2,0x502)
    ;
    if (bVar1) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
                 (ulong)(uint)(this->mState).width,
                 (ulong)(uint)((this->mState).pageSizeY + (this->mState).height),
                 (ulong)(uint)(this->mState).depth,1);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError
                        (log,"texPageCommitment [commitment height greater than expected]",GVar2,
                         0x502);
      if (bVar1) {
        if (((target == 0x806f) || (target == 0x9009)) || (target == 0x8c1a)) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
                     (ulong)(uint)(this->mState).width,(ulong)(uint)(this->mState).height,
                     (ulong)(uint)((this->mState).pageSizeZ + (this->mState).depth),1);
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError
                            (log,"texPageCommitment [commitment depth greater than expected]",GVar2,
                             0x502);
          if (!bVar1) goto LAB_00a6d0ae;
        }
        if (1 < (this->mState).pageSizeX) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,1,
                     (ulong)(uint)(this->mState).pageSizeY,(ulong)(uint)(this->mState).pageSizeZ,1);
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError
                            (log,"texPageCommitment [commitment width not multiple of page sizes X]"
                             ,GVar2,0x502);
          if (!bVar1) goto LAB_00a6d0ae;
        }
        if (1 < (this->mState).pageSizeY) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
                     (ulong)(uint)(this->mState).pageSizeX,1,(ulong)(uint)(this->mState).pageSizeZ,1
                    );
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError
                            (log,
                             "texPageCommitment [commitment height not multiple of page sizes Y]",
                             GVar2,0x502);
          if (!bVar1) goto LAB_00a6d0ae;
        }
        if ((1 < (this->mState).pageSizeZ) &&
           (((target == 0x806f || (target == 0x9009)) || (target == 0x8c1a)))) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,0,
                     (ulong)(uint)(this->mState).pageSizeX,(ulong)(uint)(this->mState).pageSizeY,
                     (ulong)(uint)(this->mState).minDepth,1);
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError
                            (log,"texPageCommitment [commitment depth not multiple of page sizes Z]"
                             ,GVar2,0x502);
        }
      }
    }
  }
LAB_00a6d0ae:
  (*gl->deleteTextures)(1,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xd4);
  return bVar1;
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyInvalidOperationErrors(const Functions& gl, GLint target, GLint format,
																   GLuint& texture)
{
	mLog << "Verify INVALID_OPERATION Errors - ";

	bool result = true;

	// Case 1 - texture is not GL_TEXTURE_IMMUTABLE_FORMAT
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteri error occurred for GL_TEXTURE_SPARSE_ARB");

	GLint immutableFormat;

	gl.getTexParameteriv(target, GL_TEXTURE_IMMUTABLE_FORMAT, &immutableFormat);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameteriv error occurred for GL_TEXTURE_IMMUTABLE_FORMAT");

	if (immutableFormat == GL_FALSE)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
						  GL_TRUE);
		result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [GL_TEXTURE_IMMUTABLE_FORMAT texture]",
												 gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	Texture::Delete(gl, texture);

	// Case 2 - texture is not TEXTURE_SPARSE_ARB
	allocateTexture(gl, target, format, texture, 1);

	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [not TEXTURE_SPARSE_ARB texture]", gl.getError(),
											 GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	// Sparse allocate texture
	Texture::Delete(gl, texture);
	sparseAllocateTexture(gl, target, format, texture, 1);

	// Case 3 - commitment sizes greater than expected
	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width + mState.pageSizeX, mState.height,
					  mState.depth, GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment width greater than expected]",
											 gl.getError(), GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width, mState.height + mState.pageSizeY,
					  mState.depth, GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment height greater than expected]",
											 gl.getError(), GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width, mState.height,
						  mState.depth + mState.pageSizeZ, GL_TRUE);
		result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment depth greater than expected]",
												 gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	// Case 4 - commitment sizes not multiple of corresponding page sizes
	if (mState.pageSizeX > 1)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, 1, mState.pageSizeY, mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment width not multiple of page sizes X]",
											gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	if (mState.pageSizeY > 1)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, 1, mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment height not multiple of page sizes Y]",
											gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	if (mState.pageSizeZ > 1)
	{
		if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY,
							  mState.minDepth, GL_TRUE);
			result = SparseTextureUtils::verifyError(
				mLog, "texPageCommitment [commitment depth not multiple of page sizes Z]", gl.getError(),
				GL_INVALID_OPERATION);
			if (!result)
				goto verifing_invalid_operation_end;
		}
	}

verifing_invalid_operation_end:

	Texture::Delete(gl, texture);

	return result;
}